

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::LoadMaterialXFromAsset
               (Asset *asset,string *asset_path,PrimSpec *ps,string *warn,string *err)

{
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  bool bVar5;
  char *pcVar6;
  string str;
  MtlxModel mtlx;
  ostringstream ss_e;
  string local_340 [2];
  MtlxModel local_300;
  ostringstream local_1a8 [376];
  
  puVar1 = (asset->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(asset->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar4 < 0x20) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  local_340[0]._M_dataplus._M_p = (pointer)&local_340[0].field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,puVar1,puVar1 + uVar4);
  local_300.asset_name._M_dataplus._M_p = (pointer)&local_300.asset_name.field_2;
  local_300.asset_name._M_string_length = 0;
  local_300.asset_name.field_2._M_local_buf[0] = '\0';
  local_300.version._M_dataplus._M_p = (pointer)&local_300.version.field_2;
  local_300.version._M_string_length = 0;
  local_300.version.field_2._M_local_buf[0] = '\0';
  local_300.cms._M_dataplus._M_p = (pointer)&local_300.cms.field_2;
  local_300.cms._M_string_length = 0;
  local_300.cms.field_2._M_local_buf[0] = '\0';
  local_300.cmsconfig._M_dataplus._M_p = (pointer)&local_300.cmsconfig.field_2;
  local_300.cmsconfig._M_string_length = 0;
  local_300.cmsconfig.field_2._M_local_buf[0] = '\0';
  local_300.color_space._M_dataplus._M_p = (pointer)&local_300.color_space.field_2;
  local_300.color_space._M_string_length = 0;
  local_300.color_space.field_2._M_local_buf[0] = '\0';
  local_300.name_space._M_dataplus._M_p = (pointer)&local_300.name_space.field_2;
  local_300.name_space._M_string_length = 0;
  local_300.name_space.field_2._M_local_buf[0] = '\0';
  local_300.shader_name._M_dataplus._M_p = (pointer)&local_300.shader_name.field_2;
  local_300.shader_name._M_string_length = 0;
  local_300.shader_name.field_2._M_local_buf[0] = '\0';
  local_300.shader.v_.vtable =
       (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_300.shader.v_.storage.dynamic = (void *)0x0;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_300.surface_materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_300.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = ReadMaterialXFromString(local_340,asset_path,&local_300,warn,err);
  if (bVar2) {
    bVar2 = ToPrimSpec(&local_300,ps,err);
    bVar5 = true;
    if (bVar2) goto LAB_00241f2c;
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"LoadMaterialXFromAsset");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3f0);
    ::std::operator<<(poVar3," ");
    pcVar6 = "Failed to convert MaterialX to USD PrimSpec.";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"LoadMaterialXFromAsset");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3ec);
    ::std::operator<<(poVar3," ");
    pcVar6 = "Failed to read MaterialX.";
  }
  poVar3 = ::std::operator<<((ostream *)local_1a8,pcVar6);
  ::std::operator<<(poVar3,"\n");
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  bVar5 = false;
LAB_00241f2c:
  MtlxModel::~MtlxModel(&local_300);
  ::std::__cxx11::string::_M_dispose();
  return bVar5;
}

Assistant:

bool LoadMaterialXFromAsset(const Asset &asset, const std::string &asset_path,
                            PrimSpec &ps /* inout */, std::string *warn,
                            std::string *err) {
  (void)asset_path;
  (void)warn;

  if (asset.size() < 32) {
    if (err) {
      (*err) += "MateiralX: Asset size too small.\n";
    }
    return false;
  }

  std::string str(reinterpret_cast<const char *>(asset.data()), asset.size());

  MtlxModel mtlx;
  if (!ReadMaterialXFromString(str, asset_path, &mtlx, warn, err)) {
    PUSH_ERROR_AND_RETURN("Failed to read MaterialX.");
  }

  if (!ToPrimSpec(mtlx, ps, err)) {
    PUSH_ERROR_AND_RETURN("Failed to convert MaterialX to USD PrimSpec.");
  }

  return true;
}